

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

string * __thiscall
dynet::PickElement::as_string
          (PickElement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t i;
  ostringstream s;
  ulong local_1a8;
  ostringstream local_190 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"pick(");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  poVar1 = std::operator<<(poVar1,(string *)pvVar2);
  std::operator<<(poVar1,',');
  if (*(long *)(in_RSI + 0x60) == 0) {
    if (*(long *)(in_RSI + 0x80) == 0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                    ,0x281,
                    "virtual string dynet::PickElement::as_string(const vector<string> &) const");
    }
    std::operator<<((ostream *)local_190,'[');
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x80));
    if (sVar3 != 0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x80),0
                         );
      std::ostream::operator<<(local_190,*pvVar4);
      for (local_1a8 = 1;
          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                              (in_RSI + 0x80)), local_1a8 < sVar3; local_1a8 = local_1a8 + 1) {
        poVar1 = std::operator<<((ostream *)local_190,',');
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x80)
                            ,local_1a8);
        std::ostream::operator<<(poVar1,*pvVar4);
      }
    }
    std::operator<<((ostream *)local_190,"])");
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(local_190,**(uint **)(in_RSI + 0x60));
    std::operator<<(poVar1,')');
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

string PickElement::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "pick(" << arg_names[0] << ',';
  if(pval) { 
    s << *pval << ')';
  } else {
    assert(pvals);
    s << '[';
    if(pvals->size()) {
      s << (*pvals)[0];
      for(size_t i = 1; i < pvals->size(); ++i)
        s << ',' << (*pvals)[i];
    }
    s << "])";
  }
  return s.str();
}